

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::select_base::element::element(element *this,string *v,message *msg)

{
  pointer pcVar1;
  
  *(byte *)this = *(byte *)this | 1;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  pcVar1 = (v->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&this->id,pcVar1,pcVar1 + v->_M_string_length)
  ;
  (this->str_option)._M_dataplus._M_p = (pointer)&(this->str_option).field_2;
  (this->str_option)._M_string_length = 0;
  (this->str_option).field_2._M_local_buf[0] = '\0';
  booster::locale::basic_message<char>::basic_message(&this->tr_option,msg);
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

select_base::element::element(std::string const &v,locale::message const &msg) :
	need_translation(1),
	id(v),
	tr_option(msg)
{
}